

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

UInt32 crnlib::Backward(CLzmaEnc *p,UInt32 *backRes,UInt32 cur)

{
  uint uVar1;
  UInt32 UVar2;
  UInt32 UVar3;
  UInt32 backCur;
  UInt32 UVar4;
  uint uVar5;
  
  UVar2 = p->opt[cur].posPrev;
  UVar4 = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do {
    uVar5 = UVar2;
    if (p->opt[cur].prev1IsChar != 0) {
      p->opt[uVar5].backPrev = 0xffffffff;
      p->opt[uVar5].prev1IsChar = 0;
      uVar1 = uVar5 - 1;
      p->opt[uVar5].posPrev = uVar1;
      if (p->opt[cur].prev2 != 0) {
        p->opt[uVar1].prev1IsChar = 0;
        p->opt[uVar1].posPrev = p->opt[cur].posPrev2;
        p->opt[uVar1].backPrev = p->opt[cur].backPrev2;
      }
    }
    UVar2 = p->opt[uVar5].posPrev;
    UVar3 = p->opt[uVar5].backPrev;
    p->opt[uVar5].backPrev = UVar4;
    p->opt[uVar5].posPrev = cur;
    UVar4 = UVar3;
    cur = uVar5;
  } while (uVar5 != 0);
  *backRes = p->opt[0].backPrev;
  UVar2 = p->opt[0].posPrev;
  p->optimumCurrentIndex = UVar2;
  return UVar2;
}

Assistant:

static UInt32 Backward(CLzmaEnc* p, UInt32* backRes, UInt32 cur) {
  UInt32 posMem = p->opt[cur].posPrev;
  UInt32 backMem = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do {
    if (p->opt[cur].prev1IsChar) {
      MakeAsChar(&p->opt[posMem])
          p->opt[posMem]
              .posPrev = posMem - 1;
      if (p->opt[cur].prev2) {
        p->opt[posMem - 1].prev1IsChar = False;
        p->opt[posMem - 1].posPrev = p->opt[cur].posPrev2;
        p->opt[posMem - 1].backPrev = p->opt[cur].backPrev2;
      }
    }
    {
      UInt32 posPrev = posMem;
      UInt32 backCur = backMem;

      backMem = p->opt[posPrev].backPrev;
      posMem = p->opt[posPrev].posPrev;

      p->opt[posPrev].backPrev = backCur;
      p->opt[posPrev].posPrev = cur;
      cur = posPrev;
    }
  } while (cur != 0);
  *backRes = p->opt[0].backPrev;
  p->optimumCurrentIndex = p->opt[0].posPrev;
  return p->optimumCurrentIndex;
}